

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O3

void __thiscall xe::TcpIpLink::reset(TcpIpLink *this)

{
  deSocketState dVar1;
  
  dVar1 = deSocket_getState((this->m_socket).m_socket);
  if (dVar1 == DE_SOCKETSTATE_CONNECTED) {
    TcpIpLinkState::setState(&this->m_state,COMMLINKSTATE_READY,"");
    return;
  }
  disconnect(this);
  return;
}

Assistant:

void TcpIpLink::reset (void)
{
	// \note Just clears error state if we are connected.
	if (m_socket.getState() == DE_SOCKETSTATE_CONNECTED)
	{
		m_state.setState(COMMLINKSTATE_READY, "");

		// \todo [2012-07-10 pyry] Do we need to reset send/receive buffers?
	}
	else
		disconnect(); // Abnormal state/usage. Disconnect socket.
}